

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscalls.cpp
# Opt level: O0

int skiwi::_skiwi_file_exists(char *filename)

{
  byte bVar1;
  bool bVar2;
  undefined1 local_220 [8];
  ifstream f;
  uint local_14;
  int res;
  char *filename_local;
  
  std::ifstream::ifstream(local_220,filename,8);
  bVar1 = std::ifstream::is_open();
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    std::ifstream::close();
  }
  local_14 = (uint)bVar2;
  std::ifstream::~ifstream(local_220);
  return local_14;
}

Assistant:

int _skiwi_file_exists(const char* filename)
  {
#ifdef _WIN32
  int res = 0;
  std::string sname(filename);
  std::wstring wname = convert_string_to_wstring(sname);
  std::ifstream f(wname);
  if (f.is_open())
    {
    res = 1;
    f.close();
    }
  return res;
#else
  int res = 0;
  std::ifstream f(filename);
  if (f.is_open())
    {
    res = 1;
    f.close();
    }
  return res;
#endif
  }